

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

_Bool lab_is_tunnel(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  loc_conflict lVar2;
  undefined1 local_c9;
  undefined1 local_b1;
  undefined1 local_99;
  undefined1 local_81;
  undefined1 local_69;
  _Bool south;
  _Bool north;
  _Bool east;
  _Bool west;
  chunk_conflict *c_local;
  loc grid_local;
  
  lVar2 = (loc_conflict)next_grid(grid,L'\x04');
  _Var1 = square_ispassable((chunk *)c,lVar2);
  local_69 = true;
  if (!_Var1) {
    lVar2 = (loc_conflict)next_grid(grid,L'\x04');
    local_69 = square_iscloseddoor((chunk *)c,lVar2);
  }
  lVar2 = (loc_conflict)next_grid(grid,L'\x06');
  _Var1 = square_ispassable((chunk *)c,lVar2);
  local_81 = true;
  if (!_Var1) {
    lVar2 = (loc_conflict)next_grid(grid,L'\x06');
    local_81 = square_iscloseddoor((chunk *)c,lVar2);
  }
  lVar2 = (loc_conflict)next_grid(grid,L'\b');
  _Var1 = square_ispassable((chunk *)c,lVar2);
  local_99 = true;
  if (!_Var1) {
    lVar2 = (loc_conflict)next_grid(grid,L'\b');
    local_99 = square_iscloseddoor((chunk *)c,lVar2);
  }
  lVar2 = (loc_conflict)next_grid(grid,L'\x02');
  _Var1 = square_ispassable((chunk *)c,lVar2);
  local_b1 = true;
  if (!_Var1) {
    lVar2 = (loc_conflict)next_grid(grid,L'\x02');
    local_b1 = square_iscloseddoor((chunk *)c,lVar2);
  }
  local_c9 = false;
  if ((local_99 == local_b1) && (local_c9 = false, local_69 == local_81)) {
    local_c9 = local_99 != local_69;
  }
  return local_c9;
}

Assistant:

static bool lab_is_tunnel(struct chunk *c, struct loc grid) {
	bool west = square_ispassable(c, next_grid(grid, DIR_W)) ||
		square_iscloseddoor(c, next_grid(grid, DIR_W));
	bool east = square_ispassable(c, next_grid(grid, DIR_E)) ||
		square_iscloseddoor(c, next_grid(grid, DIR_E));
	bool north = square_ispassable(c, next_grid(grid, DIR_N)) ||
		square_iscloseddoor(c, next_grid(grid, DIR_N));
	bool south = square_ispassable(c, next_grid(grid, DIR_S)) ||
		square_iscloseddoor(c, next_grid(grid, DIR_S));

	return north == south && west == east && north != west;
}